

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall soplex::SLUFactor<double>::assign(SLUFactor<double> *this,SLUFactor<double> *old)

{
  Dring **ppDVar1;
  U *pUVar2;
  Col *pCVar3;
  int iVar4;
  uint n;
  undefined4 n_00;
  undefined4 uVar7;
  Dring *pDVar5;
  pointer pdVar6;
  double dVar8;
  int iVar9;
  TYPE TVar10;
  Timer *pTVar11;
  U *pUVar12;
  Col *pCVar13;
  Dring *pDVar14;
  Dring *pDVar15;
  Dring *pDVar16;
  Dring *pDVar17;
  vector<double,_std::allocator<double>_> *pvVar18;
  
  (this->super_SLinSolver<double>).spxout = (old->super_SLinSolver<double>).spxout;
  TVar10 = (*old->solveTime->_vptr_Timer[5])();
  pTVar11 = TimerFactory::createTimer(TVar10);
  this->solveTime = pTVar11;
  TVar10 = (*((old->super_CLUFactor<double>).factorTime)->_vptr_Timer[5])();
  pTVar11 = TimerFactory::createTimer(TVar10);
  (this->super_CLUFactor<double>).factorTime = pTVar11;
  this->uptype = old->uptype;
  this->minStability = old->minStability;
  dVar8 = old->minThreshold;
  this->lastThreshold = old->lastThreshold;
  this->minThreshold = dVar8;
  (this->super_CLUFactor<double>).stat = (old->super_CLUFactor<double>).stat;
  n_00 = (old->super_CLUFactor<double>).thedim;
  uVar7 = (old->super_CLUFactor<double>).nzCnt;
  (this->super_CLUFactor<double>).thedim = n_00;
  (this->super_CLUFactor<double>).nzCnt = uVar7;
  dVar8 = (old->super_CLUFactor<double>).maxabs;
  (this->super_CLUFactor<double>).initMaxabs = (old->super_CLUFactor<double>).initMaxabs;
  (this->super_CLUFactor<double>).maxabs = dVar8;
  dVar8 = (old->super_CLUFactor<double>).colMemMult;
  (this->super_CLUFactor<double>).rowMemMult = (old->super_CLUFactor<double>).rowMemMult;
  (this->super_CLUFactor<double>).colMemMult = dVar8;
  (this->super_CLUFactor<double>).lMemMult = (old->super_CLUFactor<double>).lMemMult;
  spx_alloc<int*>(&(this->super_CLUFactor<double>).row.perm,n_00);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).row.orig,(this->super_CLUFactor<double>).thedim);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).col.perm,(this->super_CLUFactor<double>).thedim);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).col.orig,(this->super_CLUFactor<double>).thedim);
  pvVar18 = &(this->super_CLUFactor<double>).diag;
  std::vector<double,_std::allocator<double>_>::reserve
            (pvVar18,(long)(this->super_CLUFactor<double>).thedim);
  memcpy((this->super_CLUFactor<double>).row.perm,(old->super_CLUFactor<double>).row.perm,
         (ulong)(uint)(this->super_CLUFactor<double>).thedim << 2);
  memcpy((this->super_CLUFactor<double>).row.orig,(old->super_CLUFactor<double>).row.orig,
         (ulong)(uint)(this->super_CLUFactor<double>).thedim << 2);
  memcpy((this->super_CLUFactor<double>).col.perm,(old->super_CLUFactor<double>).col.perm,
         (ulong)(uint)(this->super_CLUFactor<double>).thedim << 2);
  memcpy((this->super_CLUFactor<double>).col.orig,(old->super_CLUFactor<double>).col.orig,
         (ulong)(uint)(this->super_CLUFactor<double>).thedim << 2);
  std::vector<double,_std::allocator<double>_>::operator=
            (pvVar18,&(old->super_CLUFactor<double>).diag);
  (this->super_CLUFactor<double>).work =
       (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  iVar4 = (old->super_CLUFactor<double>).u.row.used;
  (this->super_CLUFactor<double>).u.row.size = (old->super_CLUFactor<double>).u.row.size;
  (this->super_CLUFactor<double>).u.row.used = iVar4;
  ppDVar1 = &(this->super_CLUFactor<double>).u.row.elem;
  spx_alloc<soplex::CLUFactor<double>::Dring*>(ppDVar1,(this->super_CLUFactor<double>).thedim);
  pvVar18 = &(this->super_CLUFactor<double>).u.row.val;
  std::vector<double,_std::allocator<double>_>::reserve
            (pvVar18,(long)(this->super_CLUFactor<double>).u.row.size);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.row.idx,
                  (this->super_CLUFactor<double>).u.row.size);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.row.start,
                  (this->super_CLUFactor<double>).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.row.len,
                  (this->super_CLUFactor<double>).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.row.max,
                  (this->super_CLUFactor<double>).thedim + 1);
  memcpy((this->super_CLUFactor<double>).u.row.elem,(old->super_CLUFactor<double>).u.row.elem,
         (ulong)(uint)(this->super_CLUFactor<double>).thedim * 0x18);
  std::vector<double,_std::allocator<double>_>::operator=
            (pvVar18,&(old->super_CLUFactor<double>).u.row.val);
  memcpy((this->super_CLUFactor<double>).u.row.idx,(old->super_CLUFactor<double>).u.row.idx,
         (ulong)(uint)(this->super_CLUFactor<double>).u.row.size << 2);
  memcpy((this->super_CLUFactor<double>).u.row.start,(old->super_CLUFactor<double>).u.row.start,
         (ulong)((this->super_CLUFactor<double>).thedim + 1) << 2);
  memcpy((this->super_CLUFactor<double>).u.row.len,(old->super_CLUFactor<double>).u.row.len,
         (ulong)((this->super_CLUFactor<double>).thedim + 1) << 2);
  memcpy((this->super_CLUFactor<double>).u.row.max,(old->super_CLUFactor<double>).u.row.max,
         (ulong)((this->super_CLUFactor<double>).thedim + 1) << 2);
  iVar4 = (this->super_CLUFactor<double>).thedim;
  if ((0 < iVar4) && ((this->super_CLUFactor<double>).stat == OK)) {
    pUVar2 = &(old->super_CLUFactor<double>).u;
    pUVar12 = &(this->super_CLUFactor<double>).u;
    (this->super_CLUFactor<double>).u.row.list.idx = (old->super_CLUFactor<double>).u.row.list.idx;
    pDVar14 = (old->super_CLUFactor<double>).u.row.list.next;
    pDVar16 = (Dring *)pUVar12;
    if ((U *)pDVar14 != pUVar2) {
      pDVar5 = *ppDVar1;
      pDVar15 = (Dring *)pUVar2;
      pDVar17 = (Dring *)pUVar12;
      do {
        pDVar16 = pDVar5 + pDVar14->idx;
        pDVar17->next = pDVar16;
        pDVar16->prev = pDVar17;
        pDVar15 = (((Row *)&pDVar15->next)->list).next;
        pDVar14 = pDVar15->next;
        pDVar17 = pDVar16;
      } while ((U *)pDVar14 != pUVar2);
    }
    pDVar16->next = (Dring *)pUVar12;
    (this->super_CLUFactor<double>).u.row.list.prev = pDVar16;
  }
  iVar9 = (old->super_CLUFactor<double>).u.col.used;
  (this->super_CLUFactor<double>).u.col.size = (old->super_CLUFactor<double>).u.col.size;
  (this->super_CLUFactor<double>).u.col.used = iVar9;
  ppDVar1 = &(this->super_CLUFactor<double>).u.col.elem;
  spx_alloc<soplex::CLUFactor<double>::Dring*>(ppDVar1,iVar4);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.col.idx,
                  (this->super_CLUFactor<double>).u.col.size);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.col.start,
                  (this->super_CLUFactor<double>).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.col.len,
                  (this->super_CLUFactor<double>).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.col.max,
                  (this->super_CLUFactor<double>).thedim + 1);
  if ((old->super_CLUFactor<double>).u.col.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (old->super_CLUFactor<double>).u.col.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pdVar6 = (this->super_CLUFactor<double>).u.col.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((this->super_CLUFactor<double>).u.col.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish != pdVar6) {
      (this->super_CLUFactor<double>).u.col.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = pdVar6;
    }
  }
  else {
    pvVar18 = &(this->super_CLUFactor<double>).u.col.val;
    std::vector<double,_std::allocator<double>_>::reserve
              (pvVar18,(long)(this->super_CLUFactor<double>).u.col.size);
    std::vector<double,_std::allocator<double>_>::operator=
              (pvVar18,&(old->super_CLUFactor<double>).u.col.val);
  }
  memcpy((this->super_CLUFactor<double>).u.col.elem,(old->super_CLUFactor<double>).u.col.elem,
         (ulong)(uint)(this->super_CLUFactor<double>).thedim * 0x18);
  memcpy((this->super_CLUFactor<double>).u.col.idx,(old->super_CLUFactor<double>).u.col.idx,
         (ulong)(uint)(this->super_CLUFactor<double>).u.col.size << 2);
  memcpy((this->super_CLUFactor<double>).u.col.start,(old->super_CLUFactor<double>).u.col.start,
         (ulong)((this->super_CLUFactor<double>).thedim + 1) << 2);
  memcpy((this->super_CLUFactor<double>).u.col.len,(old->super_CLUFactor<double>).u.col.len,
         (ulong)((this->super_CLUFactor<double>).thedim + 1) << 2);
  memcpy((this->super_CLUFactor<double>).u.col.max,(old->super_CLUFactor<double>).u.col.max,
         (ulong)((this->super_CLUFactor<double>).thedim + 1) << 2);
  if ((0 < (this->super_CLUFactor<double>).thedim) && ((this->super_CLUFactor<double>).stat == OK))
  {
    pCVar3 = &(old->super_CLUFactor<double>).u.col;
    pCVar13 = &(this->super_CLUFactor<double>).u.col;
    (this->super_CLUFactor<double>).u.col.list.idx = (old->super_CLUFactor<double>).u.col.list.idx;
    pDVar14 = (old->super_CLUFactor<double>).u.col.list.next;
    pDVar16 = &pCVar13->list;
    if ((Col *)pDVar14 != pCVar3) {
      pDVar5 = *ppDVar1;
      pDVar15 = &pCVar3->list;
      pDVar17 = &pCVar13->list;
      do {
        pDVar16 = pDVar5 + pDVar14->idx;
        pDVar17->next = pDVar16;
        pDVar16->prev = pDVar17;
        pDVar15 = ((Dring *)&pDVar15->next)->next;
        pDVar14 = pDVar15->next;
        pDVar17 = pDVar16;
      } while ((Col *)pDVar14 != pCVar3);
    }
    pDVar16->next = &pCVar13->list;
    (this->super_CLUFactor<double>).u.col.list.prev = pDVar16;
  }
  iVar4 = (old->super_CLUFactor<double>).l.size;
  (this->super_CLUFactor<double>).l.size = iVar4;
  iVar9 = (old->super_CLUFactor<double>).l.firstUpdate;
  (this->super_CLUFactor<double>).l.startSize = (old->super_CLUFactor<double>).l.startSize;
  (this->super_CLUFactor<double>).l.firstUpdate = iVar9;
  (this->super_CLUFactor<double>).l.firstUnused = (old->super_CLUFactor<double>).l.firstUnused;
  (this->super_CLUFactor<double>).l.updateType = (old->super_CLUFactor<double>).l.updateType;
  pvVar18 = &(this->super_CLUFactor<double>).l.val;
  std::vector<double,_std::allocator<double>_>::reserve(pvVar18,(long)iVar4);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).l.idx,(this->super_CLUFactor<double>).l.size);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).l.start,
                  (this->super_CLUFactor<double>).l.startSize);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).l.row,(this->super_CLUFactor<double>).l.startSize
                 );
  std::vector<double,_std::allocator<double>_>::operator=
            (pvVar18,&(old->super_CLUFactor<double>).l.val);
  memcpy((this->super_CLUFactor<double>).l.idx,(old->super_CLUFactor<double>).l.idx,
         (ulong)(uint)(this->super_CLUFactor<double>).l.size << 2);
  memcpy((this->super_CLUFactor<double>).l.start,(old->super_CLUFactor<double>).l.start,
         (ulong)(uint)(this->super_CLUFactor<double>).l.startSize << 2);
  memcpy((this->super_CLUFactor<double>).l.row,(old->super_CLUFactor<double>).l.row,
         (ulong)(uint)(this->super_CLUFactor<double>).l.startSize << 2);
  if ((this->super_CLUFactor<double>).l.rval.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_CLUFactor<double>).l.rval.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pvVar18 = &(this->super_CLUFactor<double>).l.rval;
    n = (this->super_CLUFactor<double>).l.start[(this->super_CLUFactor<double>).l.firstUpdate];
    std::vector<double,_std::allocator<double>_>::reserve(pvVar18,(long)(int)n);
    spx_alloc<int*>(&(this->super_CLUFactor<double>).l.ridx,n);
    spx_alloc<int*>(&(this->super_CLUFactor<double>).l.rbeg,
                    (this->super_CLUFactor<double>).thedim + 1);
    spx_alloc<int*>(&(this->super_CLUFactor<double>).l.rorig,(this->super_CLUFactor<double>).thedim)
    ;
    spx_alloc<int*>(&(this->super_CLUFactor<double>).l.rperm,(this->super_CLUFactor<double>).thedim)
    ;
    std::vector<double,_std::allocator<double>_>::operator=
              (pvVar18,&(old->super_CLUFactor<double>).l.rval);
    memcpy((this->super_CLUFactor<double>).l.ridx,(old->super_CLUFactor<double>).l.ridx,
           (ulong)n << 2);
    memcpy((this->super_CLUFactor<double>).l.rbeg,(old->super_CLUFactor<double>).l.rbeg,
           (ulong)((this->super_CLUFactor<double>).thedim + 1) << 2);
    memcpy((this->super_CLUFactor<double>).l.rorig,(old->super_CLUFactor<double>).l.rorig,
           (ulong)(uint)(this->super_CLUFactor<double>).thedim << 2);
    memcpy((this->super_CLUFactor<double>).l.rperm,(old->super_CLUFactor<double>).l.rperm,
           (ulong)(uint)(this->super_CLUFactor<double>).thedim << 2);
    return;
  }
  (this->super_CLUFactor<double>).l.rorig = (int *)0x0;
  (this->super_CLUFactor<double>).l.rperm = (int *)0x0;
  (this->super_CLUFactor<double>).l.ridx = (int *)0x0;
  (this->super_CLUFactor<double>).l.rbeg = (int *)0x0;
  return;
}

Assistant:

void SLUFactor<R>::assign(const SLUFactor<R>& old)
{
   this->spxout = old.spxout;

   solveTime = TimerFactory::createTimer(old.solveTime->type());
   this->factorTime = TimerFactory::createTimer(old.factorTime->type());

   // slufactor
   uptype        = old.uptype;
   minThreshold  = old.minThreshold;
   minStability  = old.minStability;
   lastThreshold = old.lastThreshold;

   // clufactor
   this->stat          = old.stat;
   this->thedim        = old.thedim;
   this->nzCnt         = old.nzCnt;
   this->initMaxabs    = old.initMaxabs;
   this->maxabs        = old.maxabs;
   this->rowMemMult    = old.rowMemMult;
   this->colMemMult    = old.colMemMult;
   this->lMemMult      = old.lMemMult;

   spx_alloc(this->row.perm, this->thedim);
   spx_alloc(this->row.orig, this->thedim);
   spx_alloc(this->col.perm, this->thedim);
   spx_alloc(this->col.orig, this->thedim);
   // spx_alloc(this->diag,     this->thedim);
   this->diag.reserve(this->thedim); // small performance improvement before copying

   memcpy(this->row.perm, old.row.perm, (unsigned int)this->thedim * sizeof(*this->row.perm));
   memcpy(this->row.orig, old.row.orig, (unsigned int)this->thedim * sizeof(*this->row.orig));
   memcpy(this->col.perm, old.col.perm, (unsigned int)this->thedim * sizeof(*this->col.perm));
   memcpy(this->col.orig, old.col.orig, (unsigned int)this->thedim * sizeof(*this->col.orig));

   this->diag = old.diag;

   this->work = vec.get_ptr();

   /* setup U
    */
   this->u.row.size = old.u.row.size;
   this->u.row.used = old.u.row.used;

   spx_alloc(this->u.row.elem,  this->thedim);
   this->u.row.val.reserve(this->u.row.size); // small performance improvement
   spx_alloc(this->u.row.idx,   this->u.row.size);
   spx_alloc(this->u.row.start, this->thedim + 1);
   spx_alloc(this->u.row.len,   this->thedim + 1);
   spx_alloc(this->u.row.max,   this->thedim + 1);

   memcpy(this->u.row.elem,  old.u.row.elem,
          (unsigned int)this->thedim       * sizeof(*this->u.row.elem));
   this->u.row.val = old.u.row.val;
   memcpy(this->u.row.idx,   old.u.row.idx,
          (unsigned int)this->u.row.size   * sizeof(*this->u.row.idx));
   memcpy(this->u.row.start, old.u.row.start,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.row.start));
   memcpy(this->u.row.len,   old.u.row.len,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.row.len));
   memcpy(this->u.row.max,   old.u.row.max,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.row.max));

   // need to make row list ok ?
   if(this->thedim > 0 && this->stat == this->OK)
   {
      this->u.row.list.idx = old.u.row.list.idx; // .idx neu

      const typename CLUFactor<R>::Dring* oring = &old.u.row.list;
      typename CLUFactor<R>::Dring*       ring  = &this->u.row.list;

      while(oring->next != &old.u.row.list)
      {
         ring->next       = &this->u.row.elem[oring->next->idx];
         ring->next->prev = ring;
         oring            = oring->next;
         ring             = ring->next;
      }

      ring->next       = &this->u.row.list;
      ring->next->prev = ring;
   }

   this->u.col.size = old.u.col.size;
   this->u.col.used = old.u.col.used;

   spx_alloc(this->u.col.elem,  this->thedim);
   spx_alloc(this->u.col.idx,   this->u.col.size);
   spx_alloc(this->u.col.start, this->thedim + 1);
   spx_alloc(this->u.col.len,   this->thedim + 1);
   spx_alloc(this->u.col.max,   this->thedim + 1);

   if(!old.u.col.val.empty())
   {
      this->u.col.val.reserve(this->u.col.size); // small performance improvement before copying
      this->u.col.val = old.u.col.val;
   }
   else
   {
      this->u.col.val.clear();
   }

   memcpy(this->u.col.elem,  old.u.col.elem,
          (unsigned int)this->thedim       * sizeof(*this->u.col.elem));
   memcpy(this->u.col.idx,   old.u.col.idx,
          (unsigned int)this->u.col.size   * sizeof(*this->u.col.idx));
   memcpy(this->u.col.start, old.u.col.start,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.col.start));
   memcpy(this->u.col.len,   old.u.col.len,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.col.len));
   memcpy(this->u.col.max,   old.u.col.max,
          (unsigned int)(this->thedim + 1) * sizeof(*this->u.col.max));

   // need to make col list ok
   if(this->thedim > 0 && this->stat == this->OK)
   {
      this->u.col.list.idx = old.u.col.list.idx; // .idx neu

      const typename CLUFactor<R>::Dring* oring = &old.u.col.list;
      typename CLUFactor<R>::Dring*       ring  = &this->u.col.list;

      while(oring->next != &old.u.col.list)
      {
         ring->next       = &this->u.col.elem[oring->next->idx];
         ring->next->prev = ring;
         oring            = oring->next;
         ring             = ring->next;
      }

      ring->next       = &this->u.col.list;
      ring->next->prev = ring;
   }

   /* Setup L
    */
   this->l.size        = old.l.size;
   this->l.startSize   = old.l.startSize;
   this->l.firstUpdate = old.l.firstUpdate;
   this->l.firstUnused = old.l.firstUnused;
   this->l.updateType  = old.l.updateType;

   this->l.val.reserve(this->l.size); // small performance improvement for copying
   spx_alloc(this->l.idx,   this->l.size);
   spx_alloc(this->l.start, this->l.startSize);
   spx_alloc(this->l.row,   this->l.startSize);

   this->l.val = old.l.val;
   memcpy(this->l.idx,   old.l.idx, (unsigned int)this->l.size      * sizeof(*this->l.idx));
   memcpy(this->l.start, old.l.start, (unsigned int)this->l.startSize * sizeof(*this->l.start));
   memcpy(this->l.row,   old.l.row, (unsigned int)this->l.startSize * sizeof(*this->l.row));

   if(!this->l.rval.empty())
   {
      assert(old.l.ridx  != nullptr);
      assert(old.l.rbeg  != nullptr);
      assert(old.l.rorig != nullptr);
      assert(old.l.rperm != nullptr);

      int memsize = this->l.start[this->l.firstUpdate];

      this->l.rval.reserve(memsize); // small performance improvement for copying
      spx_alloc(this->l.ridx,  memsize);
      spx_alloc(this->l.rbeg,  this->thedim + 1);
      spx_alloc(this->l.rorig, this->thedim);
      spx_alloc(this->l.rperm, this->thedim);

      this->l.rval = old.l.rval;
      memcpy(this->l.ridx,  old.l.ridx, (unsigned int)memsize     * sizeof(*this->l.ridx));
      memcpy(this->l.rbeg,  old.l.rbeg, (unsigned int)(this->thedim + 1) * sizeof(*this->l.rbeg));
      memcpy(this->l.rorig, old.l.rorig, (unsigned int)this->thedim      * sizeof(*this->l.rorig));
      memcpy(this->l.rperm, old.l.rperm, (unsigned int)this->thedim      * sizeof(*this->l.rperm));
   }
   else
   {
      assert(old.l.ridx  == nullptr);
      assert(old.l.rbeg  == nullptr);
      assert(old.l.rorig == nullptr);
      assert(old.l.rperm == nullptr);

      this->l.ridx  = nullptr;
      this->l.rbeg  = nullptr;
      this->l.rorig = nullptr;
      this->l.rperm = nullptr;
   }

   assert(this->row.perm != nullptr);
   assert(this->row.orig != nullptr);
   assert(this->col.perm != nullptr);
   assert(this->col.orig != nullptr);

   assert(this->u.row.elem  != nullptr);
   assert(this->u.row.idx   != nullptr);
   assert(this->u.row.start != nullptr);
   assert(this->u.row.len   != nullptr);
   assert(this->u.row.max   != nullptr);

   assert(this->u.col.elem  != nullptr);
   assert(this->u.col.idx   != nullptr);
   assert(this->u.col.start != nullptr);
   assert(this->u.col.len   != nullptr);
   assert(this->u.col.max   != nullptr);

   assert(this->l.idx   != nullptr);
   assert(this->l.start != nullptr);
   assert(this->l.row   != nullptr);

}